

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tck-syntax.cc
# Opt level: O3

void do_output_json(system_declaration_t *sysdecl,string *delimiter,ostream *os)

{
  system_t *this;
  shared_ptr<tchecker::system::system_t> system;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  this = (system_t *)operator_new(0x348);
  tchecker::system::system_t::system_t(this,sysdecl);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<tchecker::system::system_t*>
            (&local_28,this);
  tchecker::system::output_json(os,this,delimiter);
  std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + (char)os);
  std::ostream::put((char)os);
  std::ostream::flush();
  if (local_28._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28._M_pi);
  }
  return;
}

Assistant:

void do_output_json(tchecker::parsing::system_declaration_t const & sysdecl, std::string const & delimiter, std::ostream & os)
{
  std::shared_ptr<tchecker::system::system_t> system(new tchecker::system::system_t(sysdecl));
  tchecker::system::output_json(os, *system, delimiter);
  os << std::endl;
}